

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall spdlog::pattern_formatter::compile_pattern_(pattern_formatter *this,string *pattern)

{
  pointer puVar1;
  flag_formatter *pfVar2;
  aggregate_formatter *paVar3;
  pointer __p_1;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer *__ptr;
  pointer puVar7;
  byte bVar8;
  uint uVar9;
  byte *pbVar10;
  pointer puVar11;
  byte *pbVar12;
  byte *pbVar13;
  bool bVar14;
  padding_info padding;
  padding_info padding_00;
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  user_chars;
  aggregate_formatter *local_50;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> local_48;
  vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
  *local_40;
  ulong local_38;
  
  pbVar10 = (byte *)((pattern->_M_dataplus)._M_p + pattern->_M_string_length);
  local_50 = (aggregate_formatter *)0x0;
  puVar1 = (this->formatters_).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar11 = (this->formatters_).
            super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar7 = puVar1;
  if (puVar11 != puVar1) {
    do {
      pfVar2 = (puVar7->_M_t).
               super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
               ._M_t.
               super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
               .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl;
      if (pfVar2 != (flag_formatter *)0x0) {
        (*pfVar2->_vptr_flag_formatter[1])();
      }
      (puVar7->_M_t).
      super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ._M_t.
      super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
      .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl =
           (flag_formatter *)0x0;
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar11);
    (this->formatters_).
    super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  local_40 = (vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
              *)&this->formatters_;
  pbVar13 = (byte *)(pattern->_M_dataplus)._M_p;
  if (pbVar13 != pbVar10) {
    local_38 = 0x10000000002;
    do {
      paVar3 = local_50;
      if (*pbVar13 == 0x25) {
        if (local_50 != (aggregate_formatter *)0x0) {
          local_50 = (aggregate_formatter *)0x0;
          local_48._M_head_impl = &paVar3->super_flag_formatter;
          std::
          vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
          ::
          emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                    (local_40,(unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                               *)&local_48);
          if ((aggregate_formatter *)local_48._M_head_impl != (aggregate_formatter *)0x0) {
            (*((flag_formatter *)&(local_48._M_head_impl)->_vptr_flag_formatter)->
              _vptr_flag_formatter[1])();
          }
        }
        pbVar12 = pbVar13 + 1;
        if (pbVar12 == pbVar10) {
LAB_0013208b:
          uVar5 = 0;
          uVar6 = 0;
        }
        else {
          if (*pbVar12 == 0x3d) {
            pbVar12 = pbVar13 + 2;
            uVar4 = local_38;
          }
          else {
            uVar4 = 0x10000000000;
            if (*pbVar12 == 0x2d) {
              pbVar12 = pbVar13 + 2;
              uVar4 = 0x10000000001;
            }
          }
          if ((pbVar12 == pbVar10) || (9 < *pbVar12 - 0x30)) goto LAB_0013208b;
          uVar6 = (long)(char)*pbVar12 - 0x30;
          pbVar13 = pbVar12 + 1;
          bVar14 = pbVar13 == pbVar10;
          if (bVar14) {
LAB_001320db:
            uVar5 = 0;
          }
          else {
            bVar8 = *pbVar13;
            uVar9 = (uint)bVar8;
            if (bVar8 - 0x30 < 10) {
              pbVar12 = pbVar12 + 2;
              do {
                pbVar13 = pbVar12;
                uVar6 = ((long)(char)uVar9 + uVar6 * 10) - 0x30;
                bVar14 = pbVar13 == pbVar10;
                if (bVar14) goto LAB_001320db;
                bVar8 = *pbVar13;
                uVar9 = (uint)bVar8;
                pbVar12 = pbVar13 + 1;
              } while (uVar9 - 0x30 < 10);
              pbVar12 = pbVar13 + -1;
            }
            bVar8 = bVar8 != 0x21 | bVar14;
            if (bVar8 == 0) {
              pbVar13 = pbVar12 + 2;
            }
            uVar5 = (ulong)(bVar8 ^ 1) << 0x20;
          }
          if (0x3f < uVar6) {
            uVar6 = 0x40;
          }
          uVar5 = uVar5 | uVar4;
          pbVar12 = pbVar13;
        }
        if (pbVar12 == pbVar10) break;
        puVar11 = (pointer)((ulong)puVar11 & 0xffff000000000000 | uVar5);
        pbVar13 = pbVar12;
        if ((uVar5 & 0x10000000000) == 0) {
          padding._8_8_ = puVar11;
          padding.width_ = uVar6;
          handle_flag_<spdlog::details::null_scoped_padder>(this,*pbVar12,padding);
        }
        else {
          padding_00._8_8_ = puVar11;
          padding_00.width_ = uVar6;
          handle_flag_<spdlog::details::scoped_padder>(this,*pbVar12,padding_00);
        }
      }
      else {
        if (local_50 == (aggregate_formatter *)0x0) {
          local_50 = (aggregate_formatter *)operator_new(0x38);
          (local_50->super_flag_formatter)._vptr_flag_formatter = (_func_int **)0x0;
          (local_50->super_flag_formatter).padinfo_.width_ = 0;
          (local_50->super_flag_formatter).padinfo_.side_ = left;
          (local_50->super_flag_formatter).padinfo_.truncate_ = false;
          (local_50->super_flag_formatter).padinfo_.enabled_ = false;
          *(undefined2 *)&(local_50->super_flag_formatter).padinfo_.field_0xe = 0;
          (local_50->str_)._M_dataplus._M_p = (pointer)0x0;
          (local_50->str_)._M_string_length = 0;
          (local_50->str_).field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(local_50->str_).field_2 + 8) = 0;
          (local_50->super_flag_formatter)._vptr_flag_formatter =
               (_func_int **)&PTR__aggregate_formatter_00197ef0;
          (local_50->str_)._M_dataplus._M_p = (pointer)&(local_50->str_).field_2;
          (local_50->str_)._M_string_length = 0;
          (local_50->str_).field_2._M_local_buf[0] = '\0';
          local_48._M_head_impl = (flag_formatter *)0x0;
        }
        std::__cxx11::string::push_back((char)local_50 + '\x18');
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != pbVar10);
  }
  paVar3 = local_50;
  if (local_50 != (aggregate_formatter *)0x0) {
    local_50 = (aggregate_formatter *)0x0;
    local_48._M_head_impl = &paVar3->super_flag_formatter;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              (local_40,(unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                         *)&local_48);
    if ((aggregate_formatter *)local_48._M_head_impl != (aggregate_formatter *)0x0) {
      (*((flag_formatter *)&(local_48._M_head_impl)->_vptr_flag_formatter)->_vptr_flag_formatter[1])
                ();
    }
  }
  if (local_50 != (aggregate_formatter *)0x0) {
    CLI::std::default_delete<spdlog::details::aggregate_formatter>::operator()
              ((default_delete<spdlog::details::aggregate_formatter> *)&local_50,local_50);
  }
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::compile_pattern_(const std::string &pattern)
{
    auto end = pattern.end();
    std::unique_ptr<details::aggregate_formatter> user_chars;
    formatters_.clear();
    for (auto it = pattern.begin(); it != end; ++it)
    {
        if (*it == '%')
        {
            if (user_chars) // append user chars found so far
            {
                formatters_.push_back(std::move(user_chars));
            }

            auto padding = handle_padspec_(++it, end);

            if (it != end)
            {
                if (padding.enabled())
                {
                    handle_flag_<details::scoped_padder>(*it, padding);
                }
                else
                {
                    handle_flag_<details::null_scoped_padder>(*it, padding);
                }
            }
            else
            {
                break;
            }
        }
        else // chars not following the % sign should be displayed as is
        {
            if (!user_chars)
            {
                user_chars = details::make_unique<details::aggregate_formatter>();
            }
            user_chars->add_ch(*it);
        }
    }
    if (user_chars) // append raw chars found so far
    {
        formatters_.push_back(std::move(user_chars));
    }
}